

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::MetaPage::Unserialize<AutoFile>(MetaPage *this,AutoFile *s)

{
  long lVar1;
  uint32_t uVar2;
  runtime_error *prVar3;
  uint32_t *in_RDI;
  long in_FS_OFFSET;
  uint32_t uint32_flags;
  uint8_t uint8_type;
  uint32_t in_stack_ffffffffffffff8c;
  array<std::byte,_20UL> *in_stack_ffffffffffffff90;
  AutoFile *in_stack_ffffffffffffff98;
  uint32_t local_10;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90->_M_elems);
  *(bool *)(in_RDI + 0x80) = in_RDI[3] == 0x62310500;
  AutoFile::operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90->_M_elems);
  *(undefined1 *)((long)in_RDI + 0x19) = local_9;
  AutoFile::operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90->_M_elems);
  AutoFile::operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90->_M_elems);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  if ((in_RDI[0x80] & 1) != 0) {
    local_10 = internal_bswap_32(in_stack_ffffffffffffff8c);
  }
  in_RDI[0xc] = local_10;
  AutoFile::operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(char (*) [368])in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,(char (*) [12])in_stack_ffffffffffffff90);
  AutoFile::operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90->_M_elems);
  AutoFile::operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90->_M_elems);
  if ((in_RDI[0x80] & 1) != 0) {
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    *in_RDI = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[1] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[2] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[3] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[4] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[5] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[7] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[8] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[9] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[10] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[0xb] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[0x12] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[0x13] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[0x14] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[0x15] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[0x16] = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffff8c);
    in_RDI[0x73] = uVar2;
  }
  if (in_RDI[2] == in_RDI[0x81]) {
    if (in_RDI[3] == 0x53162) {
      if (in_RDI[4] == 9) {
        if (((in_RDI[5] < 0x200) || (0x10000 < in_RDI[5])) || ((in_RDI[5] & in_RDI[5] - 1) != 0)) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Bad page size");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else if (*(char *)((long)in_RDI + 0x19) == '\t') {
          if (in_RDI[0xc] == 0x20) {
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              return;
            }
          }
          else {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar3,"Unexpected database flags, should only be 0x20 (subdatabases)");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar3,"Unexpected page type, should be 9 (BTree Metadata)");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Unsupported BDB data file version number");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    else {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Not a BDB file");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Meta page number mismatch");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> magic;
        s >> version;
        s >> pagesize;
        s >> encrypt_algo;

        other_endian = magic == BTREE_MAGIC_OE;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        s >> metaflags;
        s >> unused1;
        s >> free_list;
        s >> last_page;
        s >> partitions;
        s >> key_count;
        s >> record_count;

        uint32_t uint32_flags;
        s >> uint32_flags;
        if (other_endian) {
            uint32_flags = internal_bswap_32(uint32_flags);
        }
        flags = static_cast<BTreeFlags>(uint32_flags);

        s >> uid;
        s >> unused2;
        s >> minkey;
        s >> re_len;
        s >> re_pad;
        s >> root;
        s >> unused3;
        s >> crypto_magic;
        s >> trash;
        s >> iv;
        s >> chksum;

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            magic = internal_bswap_32(magic);
            version = internal_bswap_32(version);
            pagesize = internal_bswap_32(pagesize);
            free_list = internal_bswap_32(free_list);
            last_page = internal_bswap_32(last_page);
            partitions = internal_bswap_32(partitions);
            key_count = internal_bswap_32(key_count);
            record_count = internal_bswap_32(record_count);
            unused2 = internal_bswap_32(unused2);
            minkey = internal_bswap_32(minkey);
            re_len = internal_bswap_32(re_len);
            re_pad = internal_bswap_32(re_pad);
            root = internal_bswap_32(root);
            crypto_magic = internal_bswap_32(crypto_magic);
        }

        // Page number must match
        if (page_num != expected_page_num) {
            throw std::runtime_error("Meta page number mismatch");
        }

        // Check magic
        if (magic != BTREE_MAGIC) {
            throw std::runtime_error("Not a BDB file");
        }

        // Only version 9 is supported
        if (version != 9) {
            throw std::runtime_error("Unsupported BDB data file version number");
        }

        // Page size must be 512 <= pagesize <= 64k, and be a power of 2
        if (pagesize < 512 || pagesize > 65536 || (pagesize & (pagesize - 1)) != 0) {
            throw std::runtime_error("Bad page size");
        }

        // Page type must be the btree type
        if (type != PageType::BTREE_META) {
            throw std::runtime_error("Unexpected page type, should be 9 (BTree Metadata)");
        }

        // Only supported meta-flag is subdatabase
        if (flags != BTreeFlags::SUBDB) {
            throw std::runtime_error("Unexpected database flags, should only be 0x20 (subdatabases)");
        }
    }